

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O3

void __thiscall SleighArchitecture::saveXmlHeader(SleighArchitecture *this,ostream *s)

{
  ostream *poVar1;
  char local_39;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"name","");
  local_39 = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_39,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=\"",2);
  xml_escape(s,(this->filename)._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(s,"\"",1);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"target","");
  local_39 = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_39,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=\"",2);
  xml_escape(s,(this->target)._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(s,"\"",1);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void SleighArchitecture::saveXmlHeader(ostream &s) const

{
  a_v(s,"name",filename);
  a_v(s,"target",target);
}